

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O2

void __thiscall TracerouteRunner::print_output(TracerouteRunner *this)

{
  string local_30;
  
  while (this->read_complete != true) {
    if ((ulong)(long)this->output_position <
        (ulong)((long)(this->results).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->results).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      get_output_line_abi_cxx11_(&local_30,this);
      process_output(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  while ((ulong)(long)this->output_position <
         (ulong)((long)(this->results).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->results).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    get_output_line_abi_cxx11_(&local_30,this);
    process_output(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void TracerouteRunner::print_output() {
	while(!this->read_complete) {
		if(this->output_position < this->results.size()) {
			this->process_output(this->get_output_line());
		}
	}

	while(this->output_position < this->results.size()) {
		this->process_output(this->get_output_line());
	}
}